

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void __thiscall
duckdb::ModeState<double,_duckdb::ModeStandard<double>_>::ModeRm
          (ModeState<double,_duckdb::ModeStandard<double>_> *this,idx_t frame)

{
  DataChunk *result;
  double dVar1;
  ColumnDataScanState *state;
  double *pdVar2;
  size_t sVar3;
  reference pvVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  
  state = this->scan;
  if ((state->next_row_index <= frame) || (uVar5 = state->current_row_index, frame < uVar5)) {
    result = &this->page;
    ColumnDataCollection::Seek(this->inputs,frame,state,result);
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    this->data = (double *)pvVar4->data;
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    FlatVector::VerifyFlatVector(pvVar4);
    this->validity = &pvVar4->validity;
    uVar5 = this->scan->current_row_index;
  }
  pdVar2 = this->data;
  pmVar6 = ::std::__detail::
           _Map_base<double,_std::pair<const_double,_duckdb::ModeAttr>,_std::allocator<std::pair<const_double,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<double,_std::pair<const_double,_duckdb::ModeAttr>,_std::allocator<std::pair<const_double,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->frequency_map,pdVar2 + (uint)((int)frame - (int)uVar5));
  sVar3 = pmVar6->count;
  this->nonzero = this->nonzero - (ulong)(sVar3 == 1);
  pmVar6->count = sVar3 - 1;
  if (((this->count == sVar3) &&
      (dVar1 = pdVar2[(uint)((int)frame - (int)uVar5)], dVar1 == *this->mode)) &&
     (!NAN(dVar1) && !NAN(*this->mode))) {
    this->valid = false;
  }
  return;
}

Assistant:

void ModeRm(idx_t frame) {
		const auto &key = GetCell(frame);
		auto &attr = (*frequency_map)[key];
		auto old_count = attr.count;
		nonzero -= size_t(old_count == 1);

		attr.count -= 1;
		if (count == old_count && key == *mode) {
			valid = false;
		}
	}